

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

void print_templates(void)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  pfx_output_template *local_18;
  pfx_output_template *current;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_18 = templates; local_18->name != (char *)0x0; local_18 = local_18 + 1) {
    if ((template_name == (char *)0x0) || (iVar2 = strcmp(local_18->name,template_name), iVar2 != 0)
       ) {
      if (template_name == (char *)0x0) {
        printf("%s\n",local_18->name);
      }
    }
    else {
      printf("%s",local_18->template);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void print_templates(void)
{
	const struct pfx_output_template *current = templates;

	while (current->name) {
		if (template_name && strcmp(current->name, template_name) == 0)
			printf("%s", current->template);
		else if (!template_name)
			printf("%s\n", current->name);

		++current;
	}
}